

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

ulong __thiscall QLocale::toULong(QLocale *this,QStringView s,bool *ok)

{
  QLocalePrivate *pQVar1;
  QSimpleParsedNumber<unsigned_long_long> QVar2;
  
  pQVar1 = (this->d).d.ptr;
  QVar2 = QLocaleData::stringToUnsLongLong
                    (pQVar1->m_data,s,10,
                     (NumberOptions)
                     (pQVar1->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                     super_QFlagsStorage<QLocale::NumberOption>.i);
  if (ok != (bool *)0x0) {
    *ok = 0 < QVar2.used;
  }
  return QVar2.result;
}

Assistant:

ulong QLocale::toULong(QStringView s, bool *ok) const
{
    return toIntegral_helper<ulong>(d, s, ok);
}